

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O2

char * google::protobuf::internal::TcParser::MpString<true>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  ushort uVar1;
  byte *pbVar2;
  bool bVar3;
  uint uVar4;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 table_00;
  char *pcVar5;
  TailCallParseFunc UNRECOVERED_JUMPTABLE;
  void *x;
  ArenaStringPtr *this;
  ushort *puVar6;
  Cord *cord;
  Cord **ppCVar7;
  string *s;
  undefined8 *puVar8;
  ulong uVar9;
  uint *puVar10;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar11;
  ParseContext *extraout_RDX;
  ParseContext *extraout_RDX_00;
  ParseContext *extraout_RDX_01;
  ParseContext *entry;
  ParseContext *ctx_00;
  Arena *arena;
  uint16_t xform_val;
  uint64_t uVar12;
  ushort uVar13;
  string_view wire_bytes;
  ushort local_54;
  
  uVar12 = hasbits;
  table_00 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
             RefAt<google::protobuf::internal::TcParseTableBase::FieldEntry>
                       (table,(ulong)data.field_0 >> 0x20);
  xform_val = (uint16_t)uVar12;
  if ((data.field_0._0_4_ & 7) == 2) {
    uVar1 = *(uint16_t *)(table_00.data + 10);
    uVar13 = uVar1 & 0x30;
    if (uVar13 == 0x20) {
      pcVar5 = MpRepeatedString<true>(msg,ptr,ctx,data,table,hasbits);
      return pcVar5;
    }
    if (uVar13 == 0x10) {
      pbVar2 = (byte *)((long)&msg->_vptr_MessageLite +
                       ((long)(int)*(uint32_t *)(table_00.data + 4) >> 3));
      *pbVar2 = *pbVar2 | '\x01' << (*(uint32_t *)(table_00.data + 4) & 7);
      bVar3 = false;
    }
    else if (uVar13 == 0x30) {
      bVar3 = ChangeOneof(table,(FieldEntry *)table_00,data.field_0._0_4_ >> 3,
                          (ParseContext *)(ulong)(uVar1 & 0x600),msg);
    }
    else {
      bVar3 = false;
    }
    x = MaybeGetSplitBase(msg,true,table);
    local_54 = (ushort)(uVar1 & 0x600);
    if ((uVar1 & 0x1c0) == 0x80) {
      if (uVar13 == 0x30) {
        if (bVar3 == false) {
          ppCVar7 = RefAt<absl::lts_20240722::Cord*>(msg,(ulong)*(uint *)table_00);
          cord = *ppCVar7;
        }
        else {
          arena = (Arena *)(msg->_internal_metadata_).ptr_;
          if (((ulong)arena & 1) != 0) {
            arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
          }
          aVar11 = table_00;
          cord = Arena::Create<absl::lts_20240722::Cord>(arena);
          ppCVar7 = RefAt<absl::lts_20240722::Cord*>(msg,(ulong)*(uint *)table_00);
          *ppCVar7 = cord;
          table_00 = aVar11;
        }
      }
      else {
        cord = RefAt<absl::lts_20240722::Cord>(x,(ulong)*(uint *)table_00);
      }
      puVar6 = (ushort *)InlineCordParser(cord,ptr,ctx);
      aVar11 = table_00;
      ctx_00 = entry;
      if (puVar6 == (ushort *)0x0) goto LAB_0026b91e;
      MpVerifyUtf8(cord,(TcParseTableBase *)ptr,(FieldEntry *)entry,local_54);
    }
    else {
      if ((uVar1 & 0x1c0) != 0) {
        Unreachable("/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_lite.cc"
                    ,0x8a0);
      }
      this = RefAt<google::protobuf::internal::ArenaStringPtr>(x,(ulong)*(uint *)table_00);
      if (bVar3 != false) {
        (this->tagged_ptr_).ptr_ = &fixed_address_empty_string_abi_cxx11_;
      }
      aVar11 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)(msg->_internal_metadata_).ptr_;
      if ((aVar11.data & 1) != 0) {
        aVar11 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                 ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)(aVar11.data & 0xfffffffffffffffe))->
                 data;
      }
      if ((Arena *)aVar11.data == (Arena *)0x0) {
        s = ArenaStringPtr::MutableNoCopy_abi_cxx11_(this,(Arena *)0x0);
        puVar6 = (ushort *)InlineGreedyStringParser(s,ptr,ctx);
        ctx_00 = extraout_RDX_00;
      }
      else {
        puVar6 = (ushort *)
                 EpsCopyInputStream::ReadArenaString
                           (&ctx->super_EpsCopyInputStream,ptr,this,(Arena *)aVar11);
        ctx_00 = extraout_RDX;
      }
      if (puVar6 == (ushort *)0x0) {
LAB_0026b91e:
        pcVar5 = Error(msg,ptr,ctx_00,(TcFieldData)aVar11,table,hasbits);
        return pcVar5;
      }
      puVar8 = (undefined8 *)((ulong)(this->tagged_ptr_).ptr_ & 0xfffffffffffffffc);
      ptr = (char *)*puVar8;
      wire_bytes._M_str = (char *)table;
      wire_bytes._M_len = (size_t)ptr;
      bVar3 = MpVerifyUtf8((TcParser *)puVar8[1],wire_bytes,(TcParseTableBase *)table_00,
                           (FieldEntry *)(ulong)local_54,xform_val);
      aVar11 = table_00;
      ctx_00 = extraout_RDX_01;
      if (!bVar3) goto LAB_0026b91e;
    }
    ptr = (char *)puVar6;
    if ((ctx->super_EpsCopyInputStream).limit_end_ <= ptr) {
      if ((ulong)table->has_bits_offset != 0) {
        puVar10 = RefAt<unsigned_int>(msg,(ulong)table->has_bits_offset);
        *puVar10 = *puVar10 | (uint)hasbits;
      }
      return (char *)(ushort *)ptr;
    }
    uVar4 = (uint)table->fast_idx_mask & (uint)*(ushort *)ptr;
    if ((uVar4 & 7) != 0) {
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x44d);
    }
    uVar9 = (ulong)(uVar4 & 0xfffffff8);
    data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                   ((ulong)*(ushort *)ptr ^ *(ulong *)(&table[1].fast_idx_mask + uVar9 * 2));
    UNRECOVERED_JUMPTABLE = *(TailCallParseFunc *)(&table[1].has_bits_offset + uVar9);
  }
  else {
    UNRECOVERED_JUMPTABLE = table->fallback;
  }
  pcVar5 = (*UNRECOVERED_JUMPTABLE)(msg,ptr,ctx,data,table,hasbits);
  return pcVar5;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::MpString(PROTOBUF_TC_PARAM_DECL) {
  const auto& entry = RefAt<FieldEntry>(table, data.entry_offset());
  const uint16_t type_card = entry.type_card;
  const uint16_t card = type_card & field_layout::kFcMask;
  const uint32_t decoded_wiretype = data.tag() & 7;

  if (decoded_wiretype != WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
    PROTOBUF_MUSTTAIL return table->fallback(PROTOBUF_TC_PARAM_PASS);
  }
  if (card == field_layout::kFcRepeated) {
    PROTOBUF_MUSTTAIL return MpRepeatedString<is_split>(PROTOBUF_TC_PARAM_PASS);
  }
  const uint16_t xform_val = type_card & field_layout::kTvMask;
  const uint16_t rep = type_card & field_layout::kRepMask;

  // Mark the field as present:
  const bool is_oneof = card == field_layout::kFcOneof;
  bool need_init = false;
  if (card == field_layout::kFcOptional) {
    SetHas(entry, msg);
  } else if (is_oneof) {
    need_init = ChangeOneof(table, entry, data.tag() >> 3, ctx, msg);
  }

  bool is_valid = false;
  void* const base = MaybeGetSplitBase(msg, is_split, table);
  switch (rep) {
    case field_layout::kRepAString: {
      auto& field = RefAt<ArenaStringPtr>(base, entry.offset);
      if (need_init) field.InitDefault();
      Arena* arena = msg->GetArena();
      if (arena) {
        ptr = ctx->ReadArenaString(ptr, &field, arena);
      } else {
        std::string* str = field.MutableNoCopy(nullptr);
        ptr = InlineGreedyStringParser(str, ptr, ctx);
      }
      if (!ptr) break;
      is_valid = MpVerifyUtf8(field.Get(), table, entry, xform_val);
      break;
    }


    case field_layout::kRepCord: {
      absl::Cord* field;
      if (is_oneof) {
        if (need_init) {
          field = Arena::Create<absl::Cord>(msg->GetArena());
          RefAt<absl::Cord*>(msg, entry.offset) = field;
        } else {
          field = RefAt<absl::Cord*>(msg, entry.offset);
        }
      } else {
        field = &RefAt<absl::Cord>(base, entry.offset);
      }
      ptr = InlineCordParser(field, ptr, ctx);
      if (!ptr) break;
      is_valid = MpVerifyUtf8(*field, table, entry, xform_val);
      break;
    }

    default:
      Unreachable();
  }

  if (PROTOBUF_PREDICT_FALSE(ptr == nullptr || !is_valid)) {
    PROTOBUF_MUSTTAIL return Error(PROTOBUF_TC_PARAM_NO_DATA_PASS);
  }
  PROTOBUF_MUSTTAIL return ToTagDispatch(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}